

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_Model_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_007461c0 == '\x01') {
    DAT_007461c0 = '\0';
    (*(code *)*_Pipeline_default_instance_)();
  }
  if (DAT_007461e8 == '\x01') {
    DAT_007461e8 = '\0';
    (*(code *)*_PipelineClassifier_default_instance_)();
  }
  if (DAT_00746210 == '\x01') {
    DAT_00746210 = '\0';
    (*(code *)*_PipelineRegressor_default_instance_)();
  }
  if (DAT_00746248 == '\x01') {
    DAT_00746248 = '\0';
    (*(code *)*_FeatureDescription_default_instance_)();
  }
  if (DAT_007462e0 == '\x01') {
    DAT_007462e0 = '\0';
    (*(code *)*_Metadata_default_instance_)();
  }
  if (DAT_00746360 == '\x01') {
    DAT_00746360 = '\0';
    (*(code *)*__ModelDescription_default_instance_)();
  }
  if (DAT_00746390 == '\x01') {
    DAT_00746390 = '\0';
    (*(code *)*_SerializedModel_default_instance_)();
  }
  if (DAT_007463c8 == '\x01') {
    DAT_007463c8 = 0;
    (*(code *)*_Model_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Pipeline_default_instance_.Shutdown();
  _PipelineClassifier_default_instance_.Shutdown();
  _PipelineRegressor_default_instance_.Shutdown();
  _FeatureDescription_default_instance_.Shutdown();
  _Metadata_default_instance_.Shutdown();
  _ModelDescription_default_instance_.Shutdown();
  _SerializedModel_default_instance_.Shutdown();
  _Model_default_instance_.Shutdown();
}